

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O3

void __thiscall
chrono::ChArchiveOut::out<chrono::collision::ChCollisionModel>
          (ChArchiveOut *this,
          ChNameValue<std::shared_ptr<chrono::collision::ChCollisionModel>_> *bVal)

{
  iterator iVar1;
  iterator iVar2;
  mapped_type *pmVar3;
  element_type *peVar4;
  mapped_type mVar5;
  ChCollisionModel *mvalp;
  bool already_stored;
  size_t obj_ID;
  ChValueSpecific<chrono::collision::ChCollisionModel> specVal;
  bool local_69;
  size_t local_68;
  ChValueSpecific<chrono::collision::ChCollisionModel> local_60;
  
  peVar4 = (element_type *)0x0;
  if (this->cut_all_pointers == false) {
    peVar4 = (bVal->_value->
             super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
  }
  local_60.super_ChValue._vptr_ChValue = (_func_int **)peVar4;
  iVar1 = std::
          _Hashtable<void_*,_void_*,_std::allocator<void_*>,_std::__detail::_Identity,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::find(&(this->cut_pointers)._M_h,(key_type *)&local_60);
  local_69 = false;
  local_68 = 0;
  mvalp = (ChCollisionModel *)0x0;
  if (iVar1.super__Node_iterator_base<void_*,_false>._M_cur == (__node_type *)0x0) {
    mvalp = peVar4;
  }
  local_60.super_ChValue._vptr_ChValue = (_func_int **)mvalp;
  iVar2 = std::
          _Hashtable<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->external_ptr_id)._M_h,(key_type *)&local_60);
  if (iVar2.super__Node_iterator_base<std::pair<void_*const,_unsigned_long>,_false>._M_cur ==
      (__node_type *)0x0) {
    PutPointer(this,mvalp,&local_69,&local_68);
    mVar5 = 0;
  }
  else {
    local_69 = true;
    local_60.super_ChValue._vptr_ChValue = (_func_int **)mvalp;
    pmVar3 = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<void_*,_std::pair<void_*const,_unsigned_long>,_std::allocator<std::pair<void_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->external_ptr_id,(key_type *)&local_60);
    mVar5 = *pmVar3;
  }
  ChValueSpecific<chrono::collision::ChCollisionModel>::ChValueSpecific
            (&local_60,mvalp,bVal->_name,bVal->_flags);
  (*(this->super_ChArchive)._vptr_ChArchive[0xd])(this,&local_60,(ulong)local_69,local_68,mVar5);
  local_60.super_ChValue._vptr_ChValue = (_func_int **)&PTR__ChValue_00b03028;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60.super_ChValue._name._M_dataplus._M_p != &local_60.super_ChValue._name.field_2) {
    operator_delete(local_60.super_ChValue._name._M_dataplus._M_p,
                    local_60.super_ChValue._name.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void out     (ChNameValue< std::shared_ptr<T> > bVal) {
          
          T* mptr = bVal.value().get();

          if (this->cut_all_pointers)
              mptr = 0;
          if (this->cut_pointers.find((void*)mptr) != this->cut_pointers.end())
              mptr = 0;
          bool already_stored = false;  
          size_t obj_ID = 0; 
          size_t ext_ID = 0;
          if (this->external_ptr_id.find(static_cast<void*>(mptr)) != this->external_ptr_id.end()) {
              already_stored = true;
              ext_ID = external_ptr_id[static_cast<void*>(mptr)];
          }
          else {
              PutPointer(mptr, already_stored, obj_ID);
          }
          ChValueSpecific< T > specVal(*mptr, bVal.name(), bVal.flags());
          this->out_ref( 
              specVal,
              already_stored, 
              obj_ID,
              ext_ID); // note, this class name is not platform independent
      }